

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O0

void __thiscall DummyTest_Empty_Test::TestBody(DummyTest_Empty_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Deque<int,_std::allocator<int>_> d;
  undefined2 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5a;
  undefined1 in_stack_fffffffffffffe5b;
  undefined1 in_stack_fffffffffffffe5c;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffe5d;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 uVar6;
  Deque<int,_std::allocator<int>_> *this_00;
  string local_198 [8];
  char *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe7c;
  char *in_stack_fffffffffffffe80;
  Type in_stack_fffffffffffffe8c;
  AssertHelper *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  AssertionResult local_118;
  undefined4 local_108;
  uint local_104;
  string local_100 [55];
  undefined1 local_c9;
  AssertionResult local_c8 [2];
  Deque<int,_std::allocator<int>_> local_a1;
  
  this_00 = &local_a1;
  std::allocator<int>::allocator((allocator<int> *)0x16dfd1);
  Deque<int,_std::allocator<int>_>::Deque
            (in_stack_fffffffffffffeb0,(allocator<int> *)in_stack_fffffffffffffea8.ptr_);
  std::allocator<int>::~allocator((allocator<int> *)0x16dff2);
  uVar1 = Deque<int,_std::allocator<int>_>::empty((Deque<int,_std::allocator<int>_> *)0x16dfff);
  local_c9 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe5e,
                                             CONCAT15(in_stack_fffffffffffffe5d,
                                                      CONCAT14(in_stack_fffffffffffffe5c,
                                                               CONCAT13(in_stack_fffffffffffffe5b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe5a,
                                                  in_stack_fffffffffffffe58)))))),(type *)0x16e02b);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  uVar6 = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (Message *)in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_100);
    testing::Message::~Message((Message *)0x16e150);
  }
  local_104 = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16e1e1);
  if (local_104 == 0) {
    local_108 = 1;
    Deque<int,_std::allocator<int>_>::push_back
              (in_stack_fffffffffffffea0,
               (value_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    uVar3 = Deque<int,_std::allocator<int>_>::empty((Deque<int,_std::allocator<int>_> *)0x16e221);
    bVar4 = ~uVar3 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_00,
               (bool *)CONCAT17(uVar1,CONCAT16(uVar6,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_fffffffffffffe5c,
                                                  CONCAT13(in_stack_fffffffffffffe5b,
                                                           CONCAT12(in_stack_fffffffffffffe5a,
                                                                    in_stack_fffffffffffffe58)))))),
               (type *)0x16e24f);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    uVar5 = bVar2;
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(bVar4,in_stack_fffffffffffffee0),
                 (Message *)in_stack_fffffffffffffed8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
      testing::Message::~Message((Message *)0x16e335);
    }
    local_104 = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x16e3c0);
    if (local_104 == 0) {
      Deque<int,_std::allocator<int>_>::pop_back(in_stack_fffffffffffffea0);
      bVar2 = Deque<int,_std::allocator<int>_>::empty((Deque<int,_std::allocator<int>_> *)0x16e3ed);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)this_00,
                 (bool *)CONCAT17(uVar1,CONCAT16(uVar6,CONCAT15(uVar3,CONCAT14(uVar5,CONCAT13(bVar2,
                                                  CONCAT12(in_stack_fffffffffffffe5a,
                                                           in_stack_fffffffffffffe58)))))),
                 (type *)0x16e410);
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffea0);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec0);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(bVar4,in_stack_fffffffffffffee0),
                   (Message *)in_stack_fffffffffffffed8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        std::__cxx11::string::~string(local_198);
        testing::Message::~Message((Message *)0x16e4e7);
      }
      local_104 = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x16e569);
      if (local_104 == 0) {
        local_104 = 0;
      }
    }
  }
  Deque<int,_std::allocator<int>_>::~Deque(this_00);
  return;
}

Assistant:

TEST(DummyTest, Empty) {
    Deque<int> d;
    ASSERT_TRUE(d.empty());
    d.push_back(1);
    ASSERT_FALSE(d.empty());
    d.pop_back();
    ASSERT_TRUE(d.empty());
}